

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O3

CURLcode Curl_get_pathname(char **cpp,char **path,char *homedir)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  
  pcVar11 = *cpp;
  if (*pcVar11 == '\0') {
    *cpp = (char *)0x0;
    *path = (char *)0x0;
  }
  else {
    sVar4 = strspn(pcVar11," \t\r\n");
    pcVar11 = pcVar11 + sVar4;
    sVar4 = strlen(pcVar11);
    sVar5 = strlen(homedir);
    pcVar6 = (char *)(*Curl_cmalloc)(sVar5 + sVar4 + 2);
    *path = pcVar6;
    if (pcVar6 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cVar1 = *pcVar11;
    if ((cVar1 != '\'') && (cVar1 != '\"')) {
      pcVar6 = strpbrk(pcVar11," \t\r\n");
      if (pcVar6 == (char *)0x0) {
        sVar4 = strlen(pcVar11);
        pcVar6 = pcVar11 + sVar4;
      }
      sVar4 = strspn(pcVar6," \t\r\n");
      *cpp = pcVar6 + sVar4;
      if (((*pcVar11 == '/') && (pcVar11[1] == '~')) && (pcVar11[2] == '/')) {
        strcpy(*path,homedir);
        sVar4 = strlen(homedir);
        lVar7 = sVar4 + 1;
        (*path)[sVar4] = '/';
        (*path)[sVar4 + 1] = '\0';
        pcVar11 = pcVar11 + 3;
      }
      else {
        lVar7 = 0;
      }
      sVar4 = (size_t)((int)pcVar6 - (int)pcVar11);
      memcpy(*path + lVar7,pcVar11,sVar4);
      (*path)[sVar4 + lVar7] = '\0';
      return CURLE_OK;
    }
    pcVar11 = pcVar11 + 1;
    uVar8 = 0;
    uVar10 = 0;
    while( true ) {
      cVar2 = pcVar11[uVar8];
      uVar9 = (uint)uVar10;
      if (cVar2 == cVar1) break;
      if (cVar2 == '\\') {
        uVar8 = (ulong)((int)uVar8 + 1);
        bVar3 = pcVar11[uVar8];
        if ((0x3a < bVar3 - 0x22) ||
           ((0x400000000000021U >> ((ulong)(bVar3 - 0x22) & 0x3f) & 1) == 0)) goto LAB_00142aed;
      }
      else {
        if (cVar2 == '\0') goto LAB_00142aed;
        bVar3 = pcVar11[uVar8];
      }
      uVar9 = uVar9 + 1;
      (*path)[uVar10] = bVar3;
      uVar8 = (ulong)((int)uVar8 + 1);
      sVar4 = strlen(pcVar11);
      uVar10 = (ulong)uVar9;
      if (sVar4 < uVar8) goto LAB_00142ac8;
    }
    uVar8 = (ulong)((int)uVar8 + 1);
    (*path)[uVar10] = '\0';
LAB_00142ac8:
    if (uVar9 != 0) {
      sVar4 = strspn(pcVar11 + uVar8," \t\r\n");
      *cpp = pcVar11 + uVar8 + sVar4;
      return CURLE_OK;
    }
LAB_00142aed:
    (*Curl_cfree)(*path);
    *path = (char *)0x0;
  }
  return CURLE_QUOTE_ERROR;
}

Assistant:

CURLcode Curl_get_pathname(const char **cpp, char **path, char *homedir)
{
  const char *cp = *cpp, *end;
  char quot;
  unsigned int i, j;
  size_t fullPathLength, pathLength;
  bool relativePath = false;
  static const char WHITESPACE[] = " \t\r\n";

  if(!*cp) {
    *cpp = NULL;
    *path = NULL;
    return CURLE_QUOTE_ERROR;
  }
  /* Ignore leading whitespace */
  cp += strspn(cp, WHITESPACE);
  /* Allocate enough space for home directory and filename + separator */
  fullPathLength = strlen(cp) + strlen(homedir) + 2;
  *path = malloc(fullPathLength);
  if(*path == NULL)
    return CURLE_OUT_OF_MEMORY;

  /* Check for quoted filenames */
  if(*cp == '\"' || *cp == '\'') {
    quot = *cp++;

    /* Search for terminating quote, unescape some chars */
    for(i = j = 0; i <= strlen(cp); i++) {
      if(cp[i] == quot) {  /* Found quote */
        i++;
        (*path)[j] = '\0';
        break;
      }
      if(cp[i] == '\0') {  /* End of string */
        /*error("Unterminated quote");*/
        goto fail;
      }
      if(cp[i] == '\\') {  /* Escaped characters */
        i++;
        if(cp[i] != '\'' && cp[i] != '\"' &&
            cp[i] != '\\') {
          /*error("Bad escaped character '\\%c'",
              cp[i]);*/
          goto fail;
        }
      }
      (*path)[j++] = cp[i];
    }

    if(j == 0) {
      /*error("Empty quotes");*/
      goto fail;
    }
    *cpp = cp + i + strspn(cp + i, WHITESPACE);
  }
  else {
    /* Read to end of filename - either to white space or terminator */
    end = strpbrk(cp, WHITESPACE);
    if(end == NULL)
      end = strchr(cp, '\0');
    /* return pointer to second parameter if it exists */
    *cpp = end + strspn(end, WHITESPACE);
    pathLength = 0;
    relativePath = (cp[0] == '/' && cp[1] == '~' && cp[2] == '/');
    /* Handling for relative path - prepend home directory */
    if(relativePath) {
      strcpy(*path, homedir);
      pathLength = strlen(homedir);
      (*path)[pathLength++] = '/';
      (*path)[pathLength] = '\0';
      cp += 3;
    }
    /* Copy path name up until first "white space" */
    memcpy(&(*path)[pathLength], cp, (int)(end - cp));
    pathLength += (int)(end - cp);
    (*path)[pathLength] = '\0';
  }
  return CURLE_OK;

  fail:
  Curl_safefree(*path);
  return CURLE_QUOTE_ERROR;
}